

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

stbtt_uint32 stbtt__cff_int(stbtt__buf *b)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  iVar8 = b->cursor;
  lVar4 = (long)iVar8;
  iVar2 = b->size;
  if (iVar2 <= iVar8) {
LAB_0012c20c:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imstb_truetype.h"
                  ,0x4ab,"stbtt_uint32 stbtt__cff_int(stbtt__buf *)");
  }
  puVar3 = b->data;
  uVar6 = lVar4 + 1;
  iVar5 = (int)uVar6;
  b->cursor = iVar5;
  bVar1 = puVar3[lVar4];
  if ((byte)(bVar1 - 0x20) < 0xd7) {
    uVar7 = bVar1 - 0x8b;
  }
  else if ((byte)(bVar1 + 9) < 4) {
    uVar7 = 0;
    if (iVar5 < iVar2) {
      b->cursor = iVar8 + 2;
      uVar7 = (uint)puVar3[uVar6];
    }
    uVar7 = ((uint)bVar1 * 0x100 + uVar7) - 0xf694;
  }
  else if ((byte)(bVar1 + 5) < 4) {
    uVar7 = 0;
    if (iVar5 < iVar2) {
      b->cursor = iVar8 + 2;
      uVar7 = (uint)puVar3[lVar4 + 1];
    }
    uVar7 = 0xfa94 - ((uint)bVar1 << 8 | uVar7);
  }
  else if (bVar1 == 0x1c) {
    uVar7 = 0;
    iVar8 = 2;
    do {
      iVar5 = (int)uVar6;
      if (iVar5 < iVar2) {
        uVar6 = (ulong)(iVar5 + 1U);
        b->cursor = iVar5 + 1U;
        uVar9 = (uint)puVar3[iVar5];
      }
      else {
        uVar9 = 0;
      }
      uVar7 = uVar7 << 8 | uVar9;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  else {
    if (bVar1 != 0x1d) goto LAB_0012c20c;
    uVar7 = 0;
    iVar8 = 4;
    do {
      iVar5 = (int)uVar6;
      if (iVar5 < iVar2) {
        uVar6 = (ulong)(iVar5 + 1U);
        b->cursor = iVar5 + 1U;
        uVar9 = (uint)puVar3[iVar5];
      }
      else {
        uVar9 = 0;
      }
      uVar7 = uVar7 << 8 | uVar9;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  return uVar7;
}

Assistant:

static stbtt_uint32 stbtt__cff_int(stbtt__buf *b)
{
   int b0 = stbtt__buf_get8(b);
   if (b0 >= 32 && b0 <= 246)       return b0 - 139;
   else if (b0 >= 247 && b0 <= 250) return (b0 - 247)*256 + stbtt__buf_get8(b) + 108;
   else if (b0 >= 251 && b0 <= 254) return -(b0 - 251)*256 - stbtt__buf_get8(b) - 108;
   else if (b0 == 28)               return stbtt__buf_get16(b);
   else if (b0 == 29)               return stbtt__buf_get32(b);
   STBTT_assert(0);
   return 0;
}